

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# topological_sort.h
# Opt level: O0

int __thiscall
wasm::TopologicalOrdersImpl<std::less<unsigned_int>_>::Selector::select
          (Selector *this,int __nfds,fd_set *__readfds,fd_set *__writefds,fd_set *__exceptfds,
          timeval *__timeout)

{
  Index IVar1;
  uint choice;
  value_type vVar2;
  bool bVar3;
  Index IVar4;
  size_type sVar5;
  reference pvVar6;
  const_reference this_00;
  reference puVar7;
  undefined4 in_register_00000034;
  TopologicalOrdersImpl<std::less<unsigned_int>_> *this_01;
  const_iterator cStack_48;
  uint child;
  const_iterator __end3;
  const_iterator __begin3;
  value_type *__range3;
  value_type selection;
  TopologicalOrdersImpl<std::less<unsigned_int>_> *ctx_local;
  Selector *this_local;
  Selector next;
  
  this_01 = (TopologicalOrdersImpl<std::less<unsigned_int>_> *)CONCAT44(in_register_00000034,__nfds)
  ;
  if (this->count == 0) {
    __assert_fail("count >= 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/topological_sort.h"
                  ,0xde,
                  "Selector wasm::TopologicalOrdersImpl<std::less<unsigned int>>::Selector::select(TopologicalOrdersImpl<F> &) [Cmp = std::less<unsigned int>]"
                 );
  }
  IVar4 = this->start;
  IVar1 = this->count;
  sVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&this_01->buf);
  if (IVar4 + IVar1 <= sVar5) {
    IVar4 = popChoice(this_01);
    pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&this_01->buf,(ulong)this->start);
    *pvVar6 = IVar4;
    pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&this_01->buf,(ulong)this->start);
    IVar4 = this->start;
    this_00 = std::
              vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              ::operator[](this_01->graph,(ulong)*pvVar6);
    __end3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(this_00);
    cStack_48 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(this_00);
    while( true ) {
      bVar3 = __gnu_cxx::operator!=(&__end3,&stack0xffffffffffffffb8);
      if (!bVar3) {
        return IVar4 + 1;
      }
      puVar7 = __gnu_cxx::
               __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
               ::operator*(&__end3);
      choice = *puVar7;
      pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (&this_01->indegrees,(ulong)choice);
      if (*pvVar6 == 0) break;
      pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (&this_01->indegrees,(ulong)choice);
      vVar2 = *pvVar6;
      *pvVar6 = vVar2 - 1;
      if (vVar2 - 1 == 0) {
        pushChoice(this_01,choice);
      }
      __gnu_cxx::
      __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
      ::operator++(&__end3);
    }
    __assert_fail("ctx.indegrees[child] > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/topological_sort.h"
                  ,0xea,
                  "Selector wasm::TopologicalOrdersImpl<std::less<unsigned int>>::Selector::select(TopologicalOrdersImpl<F> &) [Cmp = std::less<unsigned int>]"
                 );
  }
  __assert_fail("start + count <= ctx.buf.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/topological_sort.h"
                ,0xdf,
                "Selector wasm::TopologicalOrdersImpl<std::less<unsigned int>>::Selector::select(TopologicalOrdersImpl<F> &) [Cmp = std::less<unsigned int>]"
               );
}

Assistant:

Selector select(TopologicalOrdersImpl& ctx) {
      assert(count >= 1);
      assert(start + count <= ctx.buf.size());
      if constexpr (TopologicalOrdersImpl::useMinHeap) {
        ctx.buf[start] = ctx.popChoice();
      }
      auto selection = ctx.buf[start];
      // The next selector will select the next index and will not be able to
      // choose the vertex we just selected.
      Selector next = {start + 1, count - 1, 0};
      // Append any child that this selection makes available to the choices for
      // the next selector.
      for (auto child : ctx.graph[selection]) {
        assert(ctx.indegrees[child] > 0);
        if (--ctx.indegrees[child] == 0) {
          if constexpr (TopologicalOrdersImpl::useMinHeap) {
            ctx.pushChoice(child);
          } else {
            ctx.buf[next.start + next.count] = child;
          }
          ++next.count;
        }
      }
      return next;
    }